

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O0

ion_err_t lfb_update_all(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *to_write
                        ,ion_result_count_t *count)

{
  ion_err_t iVar1;
  long local_48;
  ion_file_offset_t next;
  ion_result_count_t *piStack_38;
  ion_err_t error;
  ion_result_count_t *count_local;
  ion_byte_t *to_write_local;
  ion_file_offset_t iStack_20;
  uint num_bytes_local;
  ion_file_offset_t offset_local;
  ion_lfb_t *bag_local;
  
  piStack_38 = count;
  count_local = (ion_result_count_t *)to_write;
  to_write_local._4_4_ = num_bytes;
  iStack_20 = offset;
  offset_local = (ion_file_offset_t)bag;
  while( true ) {
    if (iStack_20 == -1) {
      return '\0';
    }
    next._7_1_ = ion_fread_at(*(ion_file_handle_t *)offset_local,iStack_20,8,(ion_byte_t *)&local_48
                             );
    if (next._7_1_ != '\0') break;
    iVar1 = lfb_update((ion_lfb_t *)offset_local,iStack_20,to_write_local._4_4_,
                       (ion_byte_t *)count_local,(ion_file_offset_t *)0x0);
    if (iVar1 != '\0') {
      return iVar1;
    }
    if (piStack_38 != (int *)0x0) {
      *piStack_38 = *piStack_38 + 1;
    }
    iStack_20 = local_48;
    next._7_1_ = 0;
  }
  return next._7_1_;
}

Assistant:

ion_err_t
lfb_update_all(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write,
	ion_result_count_t	*count
) {
	ion_err_t			error;
	ion_file_offset_t	next;

	while (ION_LFB_NULL != offset) {
		error = ion_fread_at(bag->file_handle, offset, sizeof(ion_file_offset_t), (ion_byte_t *) &next);

		if (err_ok != error) {
			return error;
		}

		error = lfb_update(bag, offset, num_bytes, to_write, NULL);

		if (err_ok != error) {
			return error;
		}

		if (NULL != count) {
			(*count)++;
		}

		offset = next;
	}

	return err_ok;
}